

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToString.hpp
# Opt level: O2

string * __thiscall
ut11::utility::detail::ParseNonIterableToString<IsNotNaNTests::Run()::NotANumber>::
ToString_abi_cxx11_(void *__return_storage_ptr__)

{
  ostream *poVar1;
  stringstream stream;
  stringstream local_190 [16];
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream(local_190);
  poVar1 = std::operator<<(local_180,"[");
  poVar1 = std::operator<<(poVar1,"ZN13IsNotNaNTests3RunEvE10NotANumber");
  std::operator<<(poVar1,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  return (string *)__return_storage_ptr__;
}

Assistant:

inline std::string ToString(const V& value, std::false_type) const
				{
					std::stringstream stream;
					stream << "[" << typeid(V).name() << "]";
					return stream.str();
				}